

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config_cmd.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  _Bool _Var4;
  
  abuf_init(&log_buf);
  cfg_add(&instance);
  BEGIN_TESTING(clear_elements);
  cunit_start_test("test_cmd_sections");
  iVar2 = cfg_cmd_handle_set(&instance,db,"stype1.",&log_buf);
  cunit_named_check(iVar2 == 0,"test_cmd_sections",0x4b,
                    "Error while adding sectiontype \'stype1\': %s",log_buf._buf);
  lVar3 = avl_find(db,"stype1");
  cunit_named_check(lVar3 != 0,"test_cmd_sections",0x4e,"\'stype1\' not found");
  if (lVar3 != 0) {
    cunit_named_check(*(int *)(lVar3 + 0x60) == 1,"test_cmd_sections",0x51,
                      "Number of named sections is not 1: %u");
    lVar3 = avl_find(lVar3 + 0x48,0);
    cunit_named_check(lVar3 != 0,"test_cmd_sections",0x54,
                      "Named section does not have the default name.");
  }
  iVar2 = cfg_cmd_handle_set(&instance,db,"stype2.",&log_buf);
  cunit_named_check(iVar2 == 0,"test_cmd_sections",0x58,
                    "Error while adding sectiontype \'stype2\': %s",log_buf._buf);
  lVar3 = avl_find(db,"stype2");
  cunit_named_check(lVar3 != 0,"test_cmd_sections",0x5b,"\'stype2\' not found");
  if (lVar3 != 0) {
    cunit_named_check(*(int *)(lVar3 + 0x60) == 1,"test_cmd_sections",0x5e,
                      "Number of named sections is not 1: %u");
    lVar3 = avl_find(lVar3 + 0x48,0);
    cunit_named_check(lVar3 != 0,"test_cmd_sections",0x61,
                      "Named section does not have the default name.");
  }
  iVar2 = cfg_cmd_handle_remove(&instance,db,"stype2.",&log_buf);
  cunit_named_check(iVar2 == 0,"test_cmd_sections",0x65,
                    "Error while removing sectiontype \'stype2\': %s",log_buf._buf);
  lVar3 = avl_find(db,"stype2");
  cunit_named_check(lVar3 == 0,"test_cmd_sections",0x68,"\'stype2\' is still in the database");
  cunit_end_test("test_cmd_sections");
  cunit_start_test("test_cmd_namedsections");
  iVar2 = cfg_cmd_handle_set(&instance,db,"stype1[name].",&log_buf);
  cunit_named_check(iVar2 == 0,"test_cmd_namedsections",0x75,
                    "Error while adding sectiontype \'stype1[name]\'");
  lVar3 = cfg_db_find_namedsection(db,"stype1","name");
  cunit_named_check(lVar3 != 0,"test_cmd_namedsections",0x78,"\'stype1[name]\' not found");
  if (lVar3 != 0) {
    pcVar1 = *(char **)(lVar3 + 0x38);
    iVar2 = strcmp(pcVar1,"name");
    cunit_named_check(iVar2 == 0,"test_cmd_namedsections",0x7a,"name of section 1 wrong: %s",pcVar1)
    ;
  }
  iVar2 = cfg_cmd_handle_set(&instance,db,"stype2[name2].",&log_buf);
  cunit_named_check(iVar2 == 0,"test_cmd_namedsections",0x7e,
                    "Error while adding sectiontype \'stype2[name2]\'");
  lVar3 = cfg_db_find_namedsection(db,"stype2","name2");
  cunit_named_check(lVar3 != 0,"test_cmd_namedsections",0x81,"\'stype2[name]\' not found");
  if (lVar3 != 0) {
    pcVar1 = *(char **)(lVar3 + 0x38);
    iVar2 = strcmp(pcVar1,"name2");
    cunit_named_check(iVar2 == 0,"test_cmd_namedsections",0x83,"name of section 2 wrong: %s",pcVar1)
    ;
  }
  iVar2 = cfg_cmd_handle_remove(&instance,db,"stype2[name2].",&log_buf);
  cunit_named_check(iVar2 == 0,"test_cmd_namedsections",0x87,
                    "Error while removing sectiontype \'stype2[name2]\'");
  lVar3 = cfg_db_find_namedsection(db,"stype2","name2");
  cunit_named_check(lVar3 == 0,"test_cmd_namedsections",0x8a,"\'stype2\' is still in the database");
  cunit_end_test("test_cmd_namedsections");
  cunit_start_test("test_cmd_entries");
  iVar2 = cfg_cmd_handle_set(&instance,db,"stype1[name1].key1=v1",&log_buf);
  cunit_named_check(iVar2 == 0,"test_cmd_entries",0x96,
                    "Error while adding entry \'stype1[name1].key1\'");
  lVar3 = cfg_db_find_entry(db,"stype1","name1","key1");
  cunit_named_check(lVar3 != 0,"test_cmd_entries",0x99,"\'stype1[name1].key1\' not found");
  if (lVar3 != 0) {
    pcVar1 = *(char **)(lVar3 + 0x40);
    if ((*pcVar1 == 'v') && (pcVar1[1] == '1')) {
      _Var4 = pcVar1[2] == '\0';
    }
    else {
      _Var4 = false;
    }
    cunit_named_check(_Var4,"test_cmd_entries",0x9b,"Value does not match \'v1\': %s");
  }
  iVar2 = cfg_cmd_handle_set(&instance,db,"stype2[name2].key2=v2",&log_buf);
  cunit_named_check(iVar2 == 0,"test_cmd_entries",0x9f,
                    "Error while adding entry \'stype2[name2].key2\'");
  lVar3 = cfg_db_find_entry(db,"stype2","name2","key2");
  cunit_named_check(lVar3 != 0,"test_cmd_entries",0xa2,"\'stype2[name2].key2\' not found");
  if (lVar3 != 0) {
    pcVar1 = *(char **)(lVar3 + 0x40);
    if ((*pcVar1 == 'v') && (pcVar1[1] == '2')) {
      _Var4 = pcVar1[2] == '\0';
    }
    else {
      _Var4 = false;
    }
    cunit_named_check(_Var4,"test_cmd_entries",0xa4,"Value does not match \'v2\': %s");
  }
  iVar2 = cfg_cmd_handle_remove(&instance,db,"stype2[name2].key2",&log_buf);
  cunit_named_check(iVar2 == 0,"test_cmd_entries",0xa9,
                    "Error while removing entry \'stype2[name2].key2\'");
  lVar3 = cfg_db_find_entry(db,"stype2","name2","key2");
  cunit_named_check(lVar3 == 0,"test_cmd_entries",0xac,
                    "\'stype2[name2].key2\' is still in the database");
  cunit_end_test("test_cmd_entries");
  abuf_free(&log_buf);
  cfg_db_remove(db);
  cfg_remove(&instance);
  iVar2 = FINISH_TESTING();
  return iVar2;
}

Assistant:

int
main(int argc __attribute__ ((unused)), char **argv __attribute__ ((unused))) {
  abuf_init(&log_buf);

  cfg_add(&instance);

  BEGIN_TESTING(clear_elements);

  test_cmd_sections();
  test_cmd_namedsections();
  test_cmd_entries();

  abuf_free(&log_buf);
  cfg_db_remove(db);
  cfg_remove(&instance);

  return FINISH_TESTING();
}